

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribfunction.cpp
# Opt level: O0

void __thiscall DistribFunction::DistribFunction(DistribFunction *this,char *fileName)

{
  FILE *__stream;
  void *pvVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  FILE *inpFile;
  
  __stream = fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Probability distribution file not found\n");
    exit(-1);
  }
  fread(in_RDI + 3,4,1,__stream);
  fread(in_RDI + 1,8,1,__stream);
  fread(in_RDI + 2,8,1,__stream);
  pvVar1 = malloc((long)*(int *)(in_RDI + 3) << 3);
  *in_RDI = pvVar1;
  fread((void *)*in_RDI,8,(long)*(int *)(in_RDI + 3),__stream);
  fclose(__stream);
  return;
}

Assistant:

DistribFunction::DistribFunction( const char *fileName ){
    FILE *inpFile = fopen( fileName, "rb" );
    if ( inpFile == NULL ) { fprintf(stderr, "Probability distribution file not found\n"); exit(-1); /*return;*/ }
    fread( &numHistIntervals, sizeof(numHistIntervals), 1, inpFile );
    fread( &minValExp, sizeof(minValExp), 1, inpFile );
    fread( &maxValExp, sizeof(maxValExp), 1, inpFile );
    distrib = (double*)malloc( numHistIntervals*sizeof(distrib[0]));
    fread( distrib, sizeof(distrib[0]), numHistIntervals, inpFile );
    fclose( inpFile );
}